

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::PrintUTF8ErrorLog
          (internal *this,string_view message_name,string_view field_name,char *operation_str,
          bool emit_stacktrace)

{
  string_view pc;
  string_view pc_00;
  string_view pc_01;
  bool bVar1;
  LogMessage *pLVar2;
  AlphaNum *c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  LogMessage local_3b0;
  Voidify local_399;
  AlphaNum local_398;
  AlphaNum local_368;
  AlphaNum local_338;
  AlphaNum local_308;
  AlphaNum local_2d8;
  undefined1 local_2a8 [8];
  string error_message;
  AlphaNum local_248;
  AlphaNum local_218;
  string local_1e8;
  AlphaNum local_1c8;
  char *local_198;
  size_t sStack_190;
  AlphaNum local_188;
  AlphaNum local_158;
  char *local_128;
  char *pcStack_120;
  AlphaNum local_110;
  AlphaNum local_e0;
  string local_b0;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string quoted_field_name;
  string stacktrace;
  bool emit_stacktrace_local;
  char *operation_str_local;
  string_view field_name_local;
  string_view message_name_local;
  
  field_name_local._M_len = field_name._M_len;
  operation_str_local = message_name._M_str;
  c = (AlphaNum *)field_name._M_str;
  field_name_local._M_str = (char *)this;
  std::__cxx11::string::string((string *)(quoted_field_name.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_79);
  std::allocator<char>::~allocator(&local_79);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&operation_str_local);
  if (!bVar1) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str)
    ;
    if (bVar1) {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_218," \'");
      pc._M_str = (char *)field_name_local._M_len;
      pc._M_len = (size_t)operation_str_local;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_248,pc);
      absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)((long)&error_message.field_2 + 8),"\'");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_1e8,(lts_20250127 *)&local_218,&local_248,
                 (AlphaNum *)((long)&error_message.field_2 + 8),c);
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    else {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_e0," \'");
      local_128 = field_name_local._M_str;
      pc_01._M_str = (char *)message_name._M_len;
      pc_01._M_len = (size_t)field_name_local._M_str;
      pcStack_120 = (char *)message_name._M_len;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_110,pc_01);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_158,".");
      local_198 = operation_str_local;
      sStack_190 = field_name_local._M_len;
      pc_00._M_str = (char *)field_name_local._M_len;
      pc_00._M_len = (size_t)operation_str_local;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_188,pc_00);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1c8,"\'");
      absl::lts_20250127::StrCat<>(&local_b0,&local_e0,&local_110,&local_158,&local_188,&local_1c8);
      std::__cxx11::string::operator=((string *)local_78,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  absl::lts_20250127::AlphaNum::AlphaNum(&local_2d8,"String field");
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_308,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_338," contains invalid UTF-8 data when ");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_368,(Nullable<const_char_*>)field_name._M_str);
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_398,
             " a protocol buffer. Use the \'bytes\' type if you intend to send raw bytes. ");
  absl::lts_20250127::StrCat<std::__cxx11::string>
            ((string *)local_2a8,(lts_20250127 *)&local_2d8,&local_308,&local_338,&local_368,
             &local_398,(AlphaNum *)((long)&quoted_field_name.field_2 + 8),in_stack_fffffffffffffc30
            );
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            (&local_3b0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_lite.cc"
             ,0x242);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_3b0);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,(string *)local_2a8);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_399,pLVar2);
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_3b0);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(quoted_field_name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void PrintUTF8ErrorLog(absl::string_view message_name,
                       absl::string_view field_name, const char* operation_str,
                       bool emit_stacktrace) {
  std::string stacktrace;
  (void)emit_stacktrace;  // Parameter is used by Google-internal code.
  std::string quoted_field_name = "";
  if (!field_name.empty()) {
    if (!message_name.empty()) {
      quoted_field_name =
          absl::StrCat(" '", message_name, ".", field_name, "'");
    } else {
      quoted_field_name = absl::StrCat(" '", field_name, "'");
    }
  }
  std::string error_message =
      absl::StrCat("String field", quoted_field_name,
                   " contains invalid UTF-8 data "
                   "when ",
                   operation_str,
                   " a protocol buffer. Use the 'bytes' type if you intend to "
                   "send raw bytes. ",
                   stacktrace);
  ABSL_LOG(ERROR) << error_message;
}